

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invent.c
# Opt level: O0

void silly_thing(char *word,obj *otmp)

{
  char cVar1;
  short sVar2;
  int iVar3;
  int otyp;
  int ocls;
  char *what;
  char *s3;
  char *s2;
  char *s1;
  obj *otmp_local;
  char *word_local;
  
  cVar1 = otmp->oclass;
  sVar2 = otmp->otyp;
  what = (char *)0x0;
  s3 = (char *)0x0;
  s2 = (char *)0x0;
  if (cVar1 == '\x03') {
    iVar3 = strcmp(word,"put on");
    if (iVar3 == 0) {
      s2 = "W";
      s3 = "wear";
      what = "";
    }
    else {
      iVar3 = strcmp(word,"remove");
      if (iVar3 == 0) {
        s2 = "T";
        s3 = "take";
        what = " off";
      }
    }
  }
  else if (((((cVar1 == '\x04') || (sVar2 == 0x113)) || (cVar1 == '\x05')) ||
           ((sVar2 == 0xee || (sVar2 == 0xef)))) || (sVar2 == 0xed)) {
    iVar3 = strcmp(word,"wear");
    if (iVar3 == 0) {
      s2 = "P";
      s3 = "put";
      what = " on";
    }
    else {
      iVar3 = strcmp(word,"take off");
      if (iVar3 == 0) {
        s2 = "R";
        s3 = "remove";
        what = "";
      }
    }
  }
  if (s2 == (char *)0x0) {
    pline("That is a silly thing to %s.",word);
  }
  else {
    _otyp = "that";
    if (((sVar2 == 0xed) || ((otmp->oclass == '\x03' && (objects[otmp->otyp].oc_subtyp == '\x03'))))
       || ((otmp->oclass == '\x03' && (objects[otmp->otyp].oc_subtyp == '\x04')))) {
      _otyp = "those";
    }
    pline("Use the \'%s\' command to %s %s%s.",s2,s3,_otyp,what);
  }
  return;
}

Assistant:

void silly_thing(const char *word, struct obj *otmp)
{
	const char *s1, *s2, *s3, *what;
	int ocls = otmp->oclass, otyp = otmp->otyp;

	s1 = s2 = s3 = 0;
	/* check for attempted use of accessory commands ('P','R') on armor
	   and for corresponding armor commands ('W','T') on accessories */
	if (ocls == ARMOR_CLASS) {
	    if (!strcmp(word, "put on"))
		s1 = "W", s2 = "wear", s3 = "";
	    else if (!strcmp(word, "remove"))
		s1 = "T", s2 = "take", s3 = " off";
	} else if ((ocls == RING_CLASS || otyp == MEAT_RING) ||
		ocls == AMULET_CLASS ||
		(otyp == BLINDFOLD || otyp == TOWEL || otyp == LENSES)) {
	    if (!strcmp(word, "wear"))
		s1 = "P", s2 = "put", s3 = " on";
	    else if (!strcmp(word, "take off"))
		s1 = "R", s2 = "remove", s3 = "";
	}
	if (s1) {
	    what = "that";
	    /* quantity for armor and accessory objects is always 1,
	       but some things should be referred to as plural */
	    if (otyp == LENSES || is_gloves(otmp) || is_boots(otmp))
		what = "those";
	    pline("Use the '%s' command to %s %s%s.", s1, s2, what, s3);
	} else {
	    pline("That is a silly thing to %s.", word);
	}
}